

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O2

double __thiscall TasGrid::RuleWavelet::eval_cubic<1>(RuleWavelet *this,int point,double x)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  if (((point == 0) && (x == 0.0)) && (!NAN(x))) {
    return 0.0;
  }
  if (4 < point) {
    iVar1 = Maths::intlog2(point + -1);
    if (iVar1 == 3) {
      iVar1 = point;
      if (0xc < (uint)point) {
        x = -x;
        iVar1 = 0x19 - point;
      }
      dVar4 = interpolate<1>(this,(double *)
                                  ((long)this->num_data_points * ((long)iVar1 + -9) * 8 +
                                  *(long *)&(this->data).
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[3].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data),x);
      if ((uint)point < 0xd) {
        return dVar4;
      }
LAB_001c7695:
      return -dVar4;
    }
    if (iVar1 == 2) {
      iVar1 = point;
      if (6 < (uint)point) {
        x = -x;
        iVar1 = 0xd - point;
      }
      dVar4 = interpolate<1>(this,(double *)
                                  ((long)this->num_data_points * ((long)iVar1 + -5) * 8 +
                                  *(long *)&(this->data).
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[2].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data),x);
      if ((uint)point < 7) {
        return dVar4;
      }
      goto LAB_001c7695;
    }
    iVar3 = 1 << ((byte)iVar1 & 0x1f);
    uVar2 = (point + -1) % iVar3;
    dVar4 = ldexp(1.0,iVar1 + -4);
    if (uVar2 < 5) {
      dVar5 = interpolate<1>(this,(double *)
                                  ((long)(int)uVar2 * (long)this->num_data_points * 8 +
                                  *(long *)&(this->data).
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[4].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data),
                             dVar4 * (x + 1.0) + -1.0);
      if ((int)(uVar2 - iVar3) < -5) goto LAB_001c781c;
    }
    else {
      if ((int)(uVar2 - iVar3) < -5) {
        dVar5 = interpolate<1>(this,(double *)
                                    ((long)this->num_data_points * 0x28 +
                                    *(long *)&(this->data).
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[4].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data),
                               dVar4 * (x + 1.0) + -1.0 + (double)(int)(uVar2 - 5) * -0.125);
        goto LAB_001c781c;
      }
      dVar5 = interpolate<1>(this,(double *)
                                  ((long)(int)(iVar3 + ~uVar2) * (long)this->num_data_points * 8 +
                                  *(long *)&(this->data).
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[4].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data),
                             dVar4 * (1.0 - x) + -1.0);
    }
    dVar4 = -dVar4;
LAB_001c781c:
    return dVar5 * dVar4;
  }
  if (point == 4) {
    point = 3;
  }
  else {
    if (point != 2) {
      dVar4 = 1.0;
      goto LAB_001c76aa;
    }
    point = 1;
  }
  x = -x;
  dVar4 = -1.0;
LAB_001c76aa:
  dVar5 = interpolate<1>(this,(double *)
                              ((long)((point + 1) / 2) * (long)this->num_data_points * 8 +
                              *(long *)&(this->data).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data),x);
  return dVar5 * dVar4;
}

Assistant:

inline double RuleWavelet::eval_cubic(int point, double x) const{
    // Helps stabilize numerical errors.
    if (point == 0 and x == 0.0 and mode == 1) return 0.0;

    // Evaluates a third order wavelet at a given point x.
    double sgn = 1.0;
    if (point < 5){ // Scaling functions
        if (point == 2){ // Reflect across y-axis
            point = 1;
            sgn = -1.0;
            x = -x;
        }else if(point == 4){
            point = 3;
            sgn = -1.0;
            x = -x;
        }
        const double *phi = &(data[1][((point+1)/2) * num_data_points]);
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    int l = Maths::intlog2(point - 1);

    if(l == 2){
        if (point > 6){
            // i.e. 7 or 8
            // These wavelets are reflections across the y-axis of 6 & 5, respectively
            x = -x;
            sgn = -1.0;
            point = 13 - point;
        }
        point -= 5;
        const double *phi = &data[2][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }else if(l == 3){
        if (point > 12){
            // i.e. 13, 14, 15, 16
            // These wavelets are reflections of 12, 11, 10, 9, respectively
            x = -x;
            sgn = -1.0;
            point = 25 - point;
        }
        point -= 9;
        const double *phi = &data[3][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    // Standard lifted wavelets.
    int subindex = (point - 1) % (1 << l);
    double scale = pow(2,l-4);
    double value;
    if (subindex < 5){
        // Left boundary wavelet.
        value = interpolate<mode>(&data[4][subindex*num_data_points], scale * (x + 1.) - 1.);
    } else if ((1 << l) - 1 - subindex < 5){
        // Right boundary wavelet.
        value = interpolate<mode>(&data[4][((1 << l) - subindex - 1)*num_data_points], scale * (1. - x) - 1.);
    } else {
        // Central wavelets.
        double shift = 0.125 * (double (subindex - 5));
        value = interpolate<mode>(&data[4][5*num_data_points], scale * (x + 1.) -1. - shift);
    }
    // Adjust for the chain rule multiplier.
    if (mode == 1) value *= ((1 << l) - 1 - subindex < 5) ? -scale : scale;

    return value;
}